

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daxpy.c
# Opt level: O0

void daxpy_(integer *n,doublereal *da,doublereal *dx,integer *incx,doublereal *dy,integer *incy)

{
  int iVar1;
  int local_48;
  integer mp1;
  integer iy;
  integer ix;
  integer m;
  integer i;
  integer *incy_local;
  doublereal *dy_local;
  integer *incx_local;
  doublereal *dx_local;
  doublereal *da_local;
  integer *n_local;
  
  if ((0 < *n) && ((*da != 0.0 || (NAN(*da))))) {
    if ((*incx == 1) && (*incy == 1)) {
      iVar1 = *n % 4;
      if (iVar1 != 0) {
        for (ix = 1; ix <= iVar1; ix = ix + 1) {
          dy[ix + -1] = *da * dx[ix + -1] + dy[ix + -1];
        }
        if (*n < 4) {
          return;
        }
      }
      for (ix = iVar1 + 1; ix <= *n; ix = ix + 4) {
        dy[ix + -1] = *da * dx[ix + -1] + dy[ix + -1];
        dy[ix] = *da * dx[ix] + dy[ix];
        dy[ix + 1] = *da * dx[ix + 1] + dy[ix + 1];
        dy[ix + 2] = *da * dx[ix + 2] + dy[ix + 2];
      }
    }
    else {
      mp1 = 1;
      local_48 = 1;
      if (*incx < 0) {
        mp1 = (1 - *n) * *incx + 1;
      }
      if (*incy < 0) {
        local_48 = (1 - *n) * *incy + 1;
      }
      for (ix = 1; ix <= *n; ix = ix + 1) {
        dy[local_48 + -1] = *da * dx[mp1 + -1] + dy[local_48 + -1];
        mp1 = *incx + mp1;
        local_48 = *incy + local_48;
      }
    }
  }
  return;
}

Assistant:

void daxpy_(integer *n, doublereal *da, doublereal *dx, 
	integer *incx, doublereal *dy, integer *incy)
{


    /* System generated locals */

    /* Local variables */
    integer i, m, ix, iy, mp1;


/*     constant times a vector plus a vector.   
       uses unrolled loops for increments equal to one.   
       jack dongarra, linpack, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define DY(I) dy[(I)-1]
#define DX(I) dx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if (*da == 0.) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	DY(iy) += *da * DX(ix);
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1   


          clean-up loop */

L20:
    m = *n % 4;
    if (m == 0) {
	goto L40;
    }
    for (i = 1; i <= m; ++i) {
	DY(i) += *da * DX(i);
/* L30: */
    }
    if (*n < 4) {
	return;
    }
L40:
    mp1 = m + 1;
    for (i = mp1; i <= *n; i += 4) {
	DY(i) += *da * DX(i);
	DY(i + 1) += *da * DX(i + 1);
	DY(i + 2) += *da * DX(i + 2);
	DY(i + 3) += *da * DX(i + 3);
/* L50: */
    }
    return;
}